

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void av1_inv_txfm_add_avx2(tran_low_t *dqcoeff,uint8_t *dst,int stride,TxfmParam *txfm_param)

{
  ulong uVar1;
  undefined1 *puVar2;
  uint8_t *puVar3;
  ulong uVar4;
  undefined1 *puVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auStack_2060 [8240];
  
  if (txfm_param->lossless != 0) {
    puVar5 = auStack_2060;
    uVar1 = 0;
    uVar6 = (ulong)(uint)tx_size_wide[txfm_param->tx_size];
    if (tx_size_wide[txfm_param->tx_size] < 1) {
      uVar6 = uVar1;
    }
    puVar2 = auStack_2060;
    puVar3 = dst;
    uVar7 = (ulong)(uint)tx_size_high[txfm_param->tx_size];
    if (tx_size_high[txfm_param->tx_size] < 1) {
      puVar2 = auStack_2060;
      uVar7 = uVar1;
    }
    for (; uVar1 != uVar7; uVar1 = uVar1 + 1) {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        *(ushort *)(puVar2 + uVar4 * 2) = (ushort)puVar3[uVar4];
      }
      puVar2 = puVar2 + 0x80;
      puVar3 = puVar3 + stride;
    }
    (*av1_highbd_inv_txfm_add)(dqcoeff,(uint8_t *)((ulong)auStack_2060 >> 1),0x40,txfm_param);
    for (uVar1 = 0; uVar1 != uVar7; uVar1 = uVar1 + 1) {
      for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
        dst[uVar4] = puVar5[uVar4 * 2];
      }
      dst = dst + stride;
      puVar5 = puVar5 + 0x80;
    }
    return;
  }
  av1_lowbd_inv_txfm2d_add_avx2
            (dqcoeff,dst,stride,txfm_param->tx_type,txfm_param->tx_size,txfm_param->eob);
  return;
}

Assistant:

void av1_inv_txfm_add_avx2(const tran_low_t *dqcoeff, uint8_t *dst, int stride,
                           const TxfmParam *txfm_param) {
  const TX_TYPE tx_type = txfm_param->tx_type;
  if (!txfm_param->lossless) {
    av1_lowbd_inv_txfm2d_add_avx2(dqcoeff, dst, stride, tx_type,
                                  txfm_param->tx_size, txfm_param->eob);
  } else {
    av1_inv_txfm_add_c(dqcoeff, dst, stride, txfm_param);
  }
}